

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

void __thiscall
ctemplate::SnippetEscape::Modify
          (SnippetEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *__s1;
  int chars_left;
  char *next_pos;
  char *limit;
  char *start;
  char *pos;
  UnclosedSnippetTags unclosed;
  string *arg_local;
  ExpandEmitter *out_local;
  PerExpandData *param_3_local;
  size_t inlen_local;
  char *in_local;
  SnippetEscape *this_local;
  
  unclosed._4_8_ = arg;
  UnclosedSnippetTags::UnclosedSnippetTags((UnclosedSnippetTags *)((long)&pos + 4));
  pcVar4 = in + inlen;
  limit = in;
  start = in;
LAB_001769e5:
  if (pcVar4 <= start) {
    EmitRun(limit,start,out);
    UnclosedSnippetTags::PrintClosingTags((UnclosedSnippetTags *)((long)&pos + 4),out);
    return;
  }
  switch(*start) {
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
    EmitRun(limit,start,out);
    (*out->_vptr_ExpandEmitter[5])(out," ",1);
    break;
  default:
    start = start + 1;
    goto LAB_001769e5;
  case '\"':
    EmitRun(limit,start,out);
    (*out->_vptr_ExpandEmitter[5])(out,"&quot;",6);
    break;
  case '&':
    EmitRun(limit,start,out);
    if ((start + 1 < pcVar4) && (start[1] == '{')) {
      (*out->_vptr_ExpandEmitter[5])(out,"&amp;",5);
    }
    else {
      (*out->_vptr_ExpandEmitter[5])(out,"&",1);
    }
    break;
  case '\'':
    EmitRun(limit,start,out);
    (*out->_vptr_ExpandEmitter[5])(out,"&#39;",5);
    break;
  case '<':
    __s1 = (int *)(start + 1);
    iVar2 = (int)pcVar4 - (int)__s1;
    if (((iVar2 < 2) || ((short)*__s1 != 0x3e62)) ||
       (bVar1 = UnclosedSnippetTags::MaybeAdd((UnclosedSnippetTags *)((long)&pos + 4),TAG_B), !bVar1
       )) {
      if (((iVar2 < 2) || ((short)*__s1 != 0x3e69)) ||
         (bVar1 = UnclosedSnippetTags::MaybeAdd((UnclosedSnippetTags *)((long)&pos + 4),TAG_I),
         !bVar1)) {
        if (((iVar2 < 3) || (iVar3 = memcmp(__s1,"em>",3), iVar3 != 0)) ||
           (bVar1 = UnclosedSnippetTags::MaybeAdd((UnclosedSnippetTags *)((long)&pos + 4),TAG_EM),
           !bVar1)) {
          if (((iVar2 < 0xd) || (iVar3 = memcmp(__s1,"span dir=",9), iVar3 != 0)) ||
             (((*(int *)(start + 10) != 0x3e72746c && (*(int *)(start + 10) != 0x3e6c7472)) ||
              (bVar1 = UnclosedSnippetTags::MaybeAdd
                                 ((UnclosedSnippetTags *)((long)&pos + 4),TAG_SPAN), !bVar1)))) {
            if (((iVar2 < 3) || (iVar3 = memcmp(__s1,"/b>",3), iVar3 != 0)) ||
               (bVar1 = UnclosedSnippetTags::MaybeRemove
                                  ((UnclosedSnippetTags *)((long)&pos + 4),TAG_B), !bVar1)) {
              if (((iVar2 < 3) || (iVar3 = memcmp(__s1,"/i>",3), iVar3 != 0)) ||
                 (bVar1 = UnclosedSnippetTags::MaybeRemove
                                    ((UnclosedSnippetTags *)((long)&pos + 4),TAG_I), !bVar1)) {
                if (((iVar2 < 4) || (*__s1 != 0x3e6d652f)) ||
                   (bVar1 = UnclosedSnippetTags::MaybeRemove
                                      ((UnclosedSnippetTags *)((long)&pos + 4),TAG_EM), !bVar1)) {
                  if (((iVar2 < 6) || (iVar3 = memcmp(__s1,"/span>",6), iVar3 != 0)) ||
                     (bVar1 = UnclosedSnippetTags::MaybeRemove
                                        ((UnclosedSnippetTags *)((long)&pos + 4),TAG_SPAN), !bVar1))
                  {
                    if ((iVar2 < 3) || (iVar3 = memcmp(__s1,"br>",3), iVar3 != 0)) {
                      if ((iVar2 < 4) || (*__s1 != 0x3e726277)) {
                        EmitRun(limit,start,out);
                        (*out->_vptr_ExpandEmitter[5])(out,"&lt;",4);
                        break;
                      }
                      start = start + 5;
                    }
                    else {
                      start = start + 4;
                    }
                  }
                  else {
                    start = start + 7;
                  }
                }
                else {
                  start = start + 5;
                }
              }
              else {
                start = start + 4;
              }
            }
            else {
              start = start + 4;
            }
          }
          else {
            start = start + 0xe;
          }
        }
        else {
          start = start + 4;
        }
      }
      else {
        start = start + 3;
      }
    }
    else {
      start = start + 3;
    }
    goto LAB_001769e5;
  case '>':
    EmitRun(limit,start,out);
    (*out->_vptr_ExpandEmitter[5])(out,"&gt;",4);
  }
  limit = start + 1;
  start = limit;
  goto LAB_001769e5;
}

Assistant:

void SnippetEscape::Modify(const char* in, size_t inlen,
                           const PerExpandData*,
                           ExpandEmitter* out, const string& arg) const {
  UnclosedSnippetTags unclosed;
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '<': {
        // If there is a permissible tag, just advance pos past it to
        // make it part of the current run.  Notice the use of
        // "continue" below.
        const char* const next_pos = pos + 1;
        const int chars_left = limit - next_pos;
        if ((chars_left >= 2) && !memcmp(next_pos, "b>", 2)
            && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("<b>");
          continue;
        } else if ((chars_left >= 2) && !memcmp(next_pos, "i>", 2)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("<i>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "em>", 3)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("<em>");
          continue;
        } else if ((chars_left >= 13) && !memcmp(next_pos, "span dir=", 9)
                   && (!memcmp(next_pos + 9, "ltr>", 4) ||
                       !memcmp(next_pos + 9, "rtl>", 4))
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("<span dir=ltr>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/b>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("</b>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/i>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("</i>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "/em>", 4)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("</em>");
          continue;
        } else if ((chars_left >= 6) && !memcmp(next_pos, "/span>", 6)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("</span>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "br>", 3)) {
          pos += strliterallen("<br>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "wbr>", 4)) {
          pos += strliterallen("<wbr>");
          continue;
        }

        // Emit the entity and break out of the switch.
        EmitRun(start, pos, out);
        APPEND("&lt;");
        break;
      }

      case '&':
        EmitRun(start, pos, out);
        if (pos + 1 < limit && pos[1] == '{') {
          // Could be a javascript entity, so we need to escape.
          // (Javascript entities are an xss risk in Netscape 4.)
          APPEND("&amp;");
        } else {
          APPEND("&");
        }
        break;

      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;

      case '\r': case '\n': case '\v': case '\f': case '\t':
        // non-space whitespace
        EmitRun(start, pos, out); APPEND(" "); break;

    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
  unclosed.PrintClosingTags(out);
}